

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_install_info.cpp
# Opt level: O2

ExtensionRepository *
duckdb::ExtensionRepository::GetDefaultRepository(optional_ptr<duckdb::DBConfig,_true> config)

{
  DBConfig *pDVar1;
  long in_RSI;
  ExtensionRepository *in_RDI;
  allocator local_31;
  optional_ptr<duckdb::DBConfig,_true> local_30;
  string local_28;
  
  if ((in_RSI != 0) &&
     (pDVar1 = optional_ptr<duckdb::DBConfig,_true>::operator->(&local_30),
     (pDVar1->options).custom_extension_repo._M_string_length != 0)) {
    ::std::__cxx11::string::string((string *)&local_28,anon_var_dwarf_4b0ffdd + 9,&local_31);
    pDVar1 = optional_ptr<duckdb::DBConfig,_true>::operator->(&local_30);
    ExtensionRepository(in_RDI,&local_28,&(pDVar1->options).custom_extension_repo);
    ::std::__cxx11::string::~string((string *)&local_28);
    return in_RDI;
  }
  GetCoreRepository();
  return in_RDI;
}

Assistant:

ExtensionRepository ExtensionRepository::GetDefaultRepository(optional_ptr<DBConfig> config) {
	if (config && !config->options.custom_extension_repo.empty()) {
		return ExtensionRepository("", config->options.custom_extension_repo);
	}

	return GetCoreRepository();
}